

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_cookies(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  char *__s;
  curl_trc_feat *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  Curl_llist_node *n;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  _Bool secure;
  long local_60;
  Curl_llist list;
  
  CVar5 = CURLE_OK;
  if (((data->set).str[0x1a] == (char *)0x0) ||
     (pcVar6 = Curl_checkheaders(data,"Cookie",6), pcVar6 != (char *)0x0)) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (data->set).str[0x1a];
  }
  if (data->cookies != (CookieInfo *)0x0 || pcVar6 != (char *)0x0) {
    iVar3 = 0;
    if (data->cookies == (CookieInfo *)0x0) {
      bVar2 = false;
      CVar5 = CURLE_OK;
    }
    else {
      bVar2 = false;
      CVar5 = CURLE_OK;
      iVar3 = 0;
      if (((data->state).field_0x775 & 8) != 0) {
        pcVar11 = (data->state).aptr.cookiehost;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = (conn->host).name;
        }
        secure = true;
        if ((((conn->handler->protocol & 0x80000002) == 0) &&
            (iVar3 = curl_strequal("localhost",pcVar11), iVar3 == 0)) &&
           (iVar3 = strcmp(pcVar11,"127.0.0.1"), iVar3 != 0)) {
          iVar3 = strcmp(pcVar11,"::1");
          secure = iVar3 == 0;
        }
        Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
        iVar4 = Curl_cookie_getlist(data,data->cookies,pcVar11,(data->state).up.path,secure,&list);
        Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
        iVar3 = 0;
        bVar2 = false;
        CVar5 = CURLE_OK;
        if (iVar4 == 0) {
          n = Curl_llist_head(&list);
          iVar3 = 0;
          local_60 = 8;
          for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
            pvVar7 = Curl_node_elem(n);
            pcVar11 = *(char **)((long)pvVar7 + 0x48);
            if (pcVar11 != (char *)0x0) {
              if (iVar3 == 0) {
                CVar5 = Curl_dyn_addn(r,"Cookie: ",8);
                if (CVar5 != CURLE_OK) {
                  iVar3 = 0;
                  bVar2 = false;
                  goto LAB_00132978;
                }
                pcVar11 = *(char **)((long)pvVar7 + 0x48);
              }
              __s = *(char **)((long)pvVar7 + 0x40);
              sVar8 = strlen(__s);
              sVar9 = strlen(pcVar11);
              if (0x1ffd < sVar9 + sVar8 + local_60 + 1) {
                bVar2 = true;
                if (data == (Curl_easy *)0x0) goto LAB_001328f7;
                CVar5 = CURLE_OK;
                if ((((data->set).field_0x8cd & 0x10) != 0) &&
                   ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar1->log_level)))) {
                  CVar5 = CURLE_OK;
                  Curl_infof(data,"Restricted outgoing cookies due to header size, \'%s\' not sent",
                             __s);
                }
                goto LAB_00132978;
              }
              pcVar10 = "; ";
              if (iVar3 == 0) {
                pcVar10 = "";
              }
              CVar5 = Curl_dyn_addf(r,"%s%s=%s",pcVar10,__s,pcVar11);
              if (CVar5 != CURLE_OK) {
                bVar2 = false;
                goto LAB_00132978;
              }
              local_60 = local_60 + (ulong)(iVar3 != 0) * 2 + sVar8 + sVar9 + 1;
              iVar3 = iVar3 + 1;
            }
          }
          bVar2 = false;
LAB_001328f7:
          CVar5 = CURLE_OK;
LAB_00132978:
          Curl_llist_destroy(&list,(void *)0x0);
        }
      }
    }
    if (((pcVar6 != (char *)0x0) && (!bVar2)) && (CVar5 == CURLE_OK)) {
      if (iVar3 == 0) {
        CVar5 = Curl_dyn_addn(r,"Cookie: ",8);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        pcVar11 = "";
      }
      else {
        pcVar11 = "; ";
      }
      CVar5 = Curl_dyn_addf(r,"%s%s",pcVar11,pcVar6);
      iVar3 = iVar3 + 1;
    }
    if ((iVar3 != 0) && (CVar5 == CURLE_OK)) {
      CVar5 = Curl_dyn_addn(r,"\r\n",2);
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_http_cookies(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  char *addcookies = NULL;
  bool linecap = FALSE;
  if(data->set.str[STRING_COOKIE] &&
     !Curl_checkheaders(data, STRCONST("Cookie")))
    addcookies = data->set.str[STRING_COOKIE];

  if(data->cookies || addcookies) {
    struct Curl_llist list;
    int count = 0;
    int rc = 1;

    if(data->cookies && data->state.cookie_engine) {
      const char *host = data->state.aptr.cookiehost ?
        data->state.aptr.cookiehost : conn->host.name;
      const bool secure_context =
        conn->handler->protocol&(CURLPROTO_HTTPS|CURLPROTO_WSS) ||
        strcasecompare("localhost", host) ||
        !strcmp(host, "127.0.0.1") ||
        !strcmp(host, "::1") ? TRUE : FALSE;
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      rc = Curl_cookie_getlist(data, data->cookies, host, data->state.up.path,
                               secure_context, &list);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    if(!rc) {
      struct Curl_llist_node *n;
      size_t clen = 8; /* hold the size of the generated Cookie: header */

      /* loop through all cookies that matched */
      for(n = Curl_llist_head(&list); n; n = Curl_node_next(n)) {
        struct Cookie *co = Curl_node_elem(n);
        if(co->value) {
          size_t add;
          if(!count) {
            result = Curl_dyn_addn(r, STRCONST("Cookie: "));
            if(result)
              break;
          }
          add = strlen(co->name) + strlen(co->value) + 1;
          if(clen + add >= MAX_COOKIE_HEADER_LEN) {
            infof(data, "Restricted outgoing cookies due to header size, "
                  "'%s' not sent", co->name);
            linecap = TRUE;
            break;
          }
          result = Curl_dyn_addf(r, "%s%s=%s", count ? "; " : "",
                                 co->name, co->value);
          if(result)
            break;
          clen += add + (count ? 2 : 0);
          count++;
        }
      }
      Curl_llist_destroy(&list, NULL);
    }
    if(addcookies && !result && !linecap) {
      if(!count)
        result = Curl_dyn_addn(r, STRCONST("Cookie: "));
      if(!result) {
        result = Curl_dyn_addf(r, "%s%s", count ? "; " : "", addcookies);
        count++;
      }
    }
    if(count && !result)
      result = Curl_dyn_addn(r, STRCONST("\r\n"));

    if(result)
      return result;
  }
  return result;
}